

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O0

void cf_chacha20_next_block(void *vctx,uint8_t *out)

{
  cf_chacha20_ctx *ctx;
  uint8_t *out_local;
  void *vctx_local;
  
  cf_chacha20_core((uint8_t *)vctx,(uint8_t *)((long)vctx + 0x10),(uint8_t *)((long)vctx + 0x20),
                   *(uint8_t **)((long)vctx + 0x30),out);
  incr_le((uint8_t *)((long)vctx + 0x20),*(size_t *)((long)vctx + 0x80));
  return;
}

Assistant:

static void cf_chacha20_next_block(void *vctx, uint8_t *out)
{
  cf_chacha20_ctx *ctx = vctx;
  cf_chacha20_core(ctx->key0,
                   ctx->key1,
                   ctx->nonce,
                   ctx->constant,
                   out);
  incr_le(ctx->nonce, ctx->ncounter);
}